

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O1

int av1_alloc_context_buffers(AV1_COMMON *cm,int width,int height,BLOCK_SIZE min_partition_size)

{
  CommonModeInfoParams *pCVar1;
  _func_void_CommonModeInfoParams_ptr *p_Var2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  MB_MODE_INFO *pMVar6;
  MB_MODE_INFO **ppMVar7;
  TX_TYPE *pTVar8;
  int iVar9;
  size_t num;
  size_t num_00;
  
  pCVar1 = &cm->mi_params;
  (*(cm->mi_params).set_mb_mi)(pCVar1,width,height,min_partition_size);
  uVar4 = (long)(cm->mi_params).mi_rows + 0x1f;
  uVar5 = uVar4 & 0xffffffffffffffe0;
  num_00 = (long)(cm->mi_params).mi_stride * uVar5;
  num = (long)(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar4 & 0xffffffe0) /
                   (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                    [(cm->mi_params).mi_alloc_bsize]) *
        (long)(cm->mi_params).mi_alloc_stride;
  iVar9 = (int)num;
  if (((cm->mi_params).mi_alloc_size < iVar9) ||
     (iVar3 = 0, (cm->mi_params).mi_grid_size < (int)num_00)) {
    (*(cm->mi_params).free_mi)(pCVar1);
    pMVar6 = (MB_MODE_INFO *)aom_calloc(num,0xb0);
    (cm->mi_params).mi_alloc = pMVar6;
    if (pMVar6 != (MB_MODE_INFO *)0x0) {
      (cm->mi_params).mi_alloc_size = iVar9;
      ppMVar7 = (MB_MODE_INFO **)aom_calloc(num_00,8);
      (cm->mi_params).mi_grid_base = ppMVar7;
      if (ppMVar7 != (MB_MODE_INFO **)0x0) {
        pTVar8 = (TX_TYPE *)aom_calloc(num_00,1);
        (cm->mi_params).tx_type_map = pTVar8;
        if (pTVar8 != (TX_TYPE *)0x0) {
          (cm->mi_params).mi_grid_size = (int)num_00;
          return 0;
        }
      }
    }
    (*(cm->mi_params).set_mb_mi)(pCVar1,0,0,BLOCK_4X4);
    p_Var2 = (cm->mi_params).free_mi;
    if (p_Var2 != (_func_void_CommonModeInfoParams_ptr *)0x0) {
      (*p_Var2)(pCVar1);
    }
    av1_free_above_context_buffers(&cm->above_contexts);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int av1_alloc_context_buffers(AV1_COMMON *cm, int width, int height,
                              BLOCK_SIZE min_partition_size) {
  CommonModeInfoParams *const mi_params = &cm->mi_params;
  mi_params->set_mb_mi(mi_params, width, height, min_partition_size);
  if (alloc_mi(mi_params)) goto fail;
  return 0;

fail:
  // clear the mi_* values to force a realloc on resync
  mi_params->set_mb_mi(mi_params, 0, 0, BLOCK_4X4);
  av1_free_context_buffers(cm);
  return 1;
}